

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1900.c
# Opt level: O0

void free_urls(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < num_handles; local_c = local_c + 1) {
    free(urlstring[local_c]);
    urlstring[local_c] = (char *)0x0;
  }
  for (local_c = 0; local_c < blacklist_num_servers; local_c = local_c + 1) {
    free(server_blacklist[local_c]);
    server_blacklist[local_c] = (char *)0x0;
  }
  for (local_c = 0; local_c < blacklist_num_sites; local_c = local_c + 1) {
    free(site_blacklist[local_c]);
    site_blacklist[local_c] = (char *)0x0;
  }
  return;
}

Assistant:

static void free_urls(void)
{
  int i;
  for(i = 0; i < num_handles; i++) {
    Curl_safefree(urlstring[i]);
  }
  for(i = 0; i < blacklist_num_servers; i++) {
    Curl_safefree(server_blacklist[i]);
  }
  for(i = 0; i < blacklist_num_sites; i++) {
    Curl_safefree(site_blacklist[i]);
  }
}